

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall
despot::util::tinyxml::TiXmlAttributeSet::Add(TiXmlAttributeSet *this,TiXmlAttribute *addMe)

{
  char *_name;
  TiXmlAttribute *pTVar1;
  TiXmlAttribute *addMe_local;
  TiXmlAttributeSet *this_local;
  
  _name = TiXmlAttribute::Name(addMe);
  pTVar1 = Find(this,_name);
  if (pTVar1 != (TiXmlAttribute *)0x0) {
    __assert_fail("!Find(addMe->Name())",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                  ,0x516,"void despot::util::tinyxml::TiXmlAttributeSet::Add(TiXmlAttribute *)");
  }
  addMe->next = &this->sentinel;
  addMe->prev = (this->sentinel).prev;
  ((this->sentinel).prev)->next = addMe;
  (this->sentinel).prev = addMe;
  return;
}

Assistant:

void TiXmlAttributeSet::Add(TiXmlAttribute* addMe) {
#ifdef TIXML_USE_STL
	assert( !Find( TIXML_STRING( addMe->Name() ) ) ); // Shouldn't be multiply adding to the set.
#else
	assert(!Find(addMe->Name())); // Shouldn't be multiply adding to the set.
#endif

	addMe->next = &sentinel;
	addMe->prev = sentinel.prev;

	sentinel.prev->next = addMe;
	sentinel.prev = addMe;
}